

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O2

exr_result_t
exr_attr_chlist_add_with_length
          (exr_context_t ctxt,exr_attr_chlist_t *clist,char *name,int32_t namelen,
          exr_pixel_type_t ptype,exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  exr_attr_chlist_entry_t *peVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  exr_attr_chlist_entry_t *peVar6;
  exr_result_t eVar7;
  int iVar8;
  char **ppcVar9;
  exr_attr_chlist_entry_t *peVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  long lVar16;
  ulong local_78;
  exr_attr_chlist_entry_t nent;
  
  nent.pixel_type = EXR_PIXEL_UINT;
  nent.p_linear = '\0';
  nent.reserved[0] = '\0';
  nent.reserved[1] = '\0';
  nent.reserved[2] = '\0';
  nent.x_sampling = 0;
  nent.y_sampling = 0;
  nent.name.length = 0;
  nent.name.alloc_size = 0;
  nent.name.str = (char *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (clist == (exr_attr_chlist_t *)0x0) {
    eVar7 = (*ctxt->report_error)(ctxt,3,"Invalid channel list pointer to chlist_add_with_length");
    return eVar7;
  }
  if (name == (char *)0x0) {
    name = "<NULL>";
  }
  else if ((namelen != 0) && (*name != '\0')) {
    if ((int)(uint)ctxt->max_name_length < namelen) {
      eVar7 = (*ctxt->print_error)
                        (ctxt,0xc,
                         "Channel name must shorter than length allowed by file (%d), received \'%s\' (%d)"
                         ,(ulong)ctxt->max_name_length,name,(ulong)(uint)namelen);
      return eVar7;
    }
    if (EXR_PIXEL_FLOAT < ptype) {
      eVar7 = (*ctxt->print_error)
                        (ctxt,3,"Invalid pixel type specified (%d) adding channel \'%s\' to list",
                         (ulong)ptype,name,ctxt->print_error);
      return eVar7;
    }
    if (EXR_PERCEPTUALLY_LINEAR < islinear) {
      eVar7 = (*ctxt->print_error)
                        (ctxt,3,
                         "Invalid perceptual linear flag value (%d) adding channel \'%s\' to list",
                         islinear,name);
      return eVar7;
    }
    if (xsamp < 1 || ysamp < 1) {
      eVar7 = (*ctxt->print_error)
                        (ctxt,3,"Invalid pixel sampling (x %d y %d) adding channel \'%s\' to list",
                         (ulong)(uint)xsamp,(ulong)(uint)ysamp,name);
      return eVar7;
    }
    peVar1 = clist->entries;
    uVar15 = 0;
    local_78 = (ulong)(uint)clist->num_channels;
    if (clist->num_channels < 1) {
      local_78 = uVar15;
    }
    ppcVar9 = &(peVar1->name).str;
    do {
      if (local_78 == uVar15) {
LAB_0011a83d:
        eVar7 = exr_attr_string_create_with_length(ctxt,&nent.name,name,namelen);
        if (eVar7 == 0) {
          iVar8 = clist->num_channels;
          lVar16 = (long)iVar8;
          nent.p_linear = (uint8_t)islinear;
          nent.pixel_type = ptype;
          nent.y_sampling = ysamp;
          nent.x_sampling = xsamp;
          if (iVar8 < clist->num_alloced) {
            peVar10 = clist->entries;
          }
          else {
            iVar2 = clist->num_alloced * 2;
            iVar14 = iVar8 + 2;
            if (iVar8 < iVar2) {
              iVar14 = iVar2;
            }
            peVar10 = (exr_attr_chlist_entry_t *)(*ctxt->alloc_fn)((long)iVar14 << 5);
            if (peVar10 == (exr_attr_chlist_entry_t *)0x0) {
              exr_attr_string_destroy(ctxt,&nent.name);
              eVar7 = (*ctxt->standard_error)(ctxt,1);
              return eVar7;
            }
            clist->num_alloced = iVar14;
          }
          lVar11 = (long)(int)local_78;
          lVar12 = lVar16 << 5;
          for (; lVar11 < lVar16; lVar16 = lVar16 + -1) {
            uVar3 = *(undefined8 *)(peVar1[-1].reserved + lVar12 + -0x15);
            uVar4 = *(undefined8 *)(peVar1[-1].reserved + lVar12 + -0x15 + 8);
            uVar5 = *(undefined8 *)(peVar1->reserved + lVar12 + -0x25 + 8);
            *(undefined8 *)(peVar10->reserved + lVar12 + -5) =
                 *(undefined8 *)(peVar1->reserved + lVar12 + -0x25);
            *(undefined8 *)(peVar10->reserved + lVar12 + -5 + 8) = uVar5;
            *(undefined8 *)(peVar10->reserved + lVar12 + -0x15) = uVar3;
            *(undefined8 *)(peVar10->reserved + lVar12 + -0x15 + 8) = uVar4;
            lVar12 = lVar12 + -0x20;
          }
          peVar6 = peVar10 + lVar11;
          peVar6->pixel_type = nent.pixel_type;
          peVar6->p_linear = nent.p_linear;
          peVar6->reserved[0] = nent.reserved[0];
          peVar6->reserved[1] = nent.reserved[1];
          peVar6->reserved[2] = nent.reserved[2];
          *(undefined8 *)(&peVar6->pixel_type + 2) = nent._24_8_;
          peVar6 = peVar10 + lVar11;
          (peVar6->name).length = nent.name.length;
          (peVar6->name).alloc_size = nent.name.alloc_size;
          (peVar6->name).str = nent.name.str;
          if ((peVar1 != (exr_attr_chlist_entry_t *)0x0) && (peVar10 != peVar1)) {
            for (lVar16 = 0; local_78 << 5 != lVar16; lVar16 = lVar16 + 0x20) {
              uVar3 = *(undefined8 *)(peVar1->reserved + lVar16 + -0x15);
              uVar4 = *(undefined8 *)(peVar1->reserved + lVar16 + -0x15 + 8);
              uVar5 = *(undefined8 *)(peVar1->reserved + lVar16 + -5 + 8);
              *(undefined8 *)(peVar10->reserved + lVar16 + -5) =
                   *(undefined8 *)(peVar1->reserved + lVar16 + -5);
              *(undefined8 *)(peVar10->reserved + lVar16 + -5 + 8) = uVar5;
              *(undefined8 *)(peVar10->reserved + lVar16 + -0x15) = uVar3;
              *(undefined8 *)(peVar10->reserved + lVar16 + -0x15 + 8) = uVar4;
            }
            (*ctxt->free_fn)(peVar1);
          }
          clist->num_channels = iVar8 + 1;
          clist->entries = peVar10;
          eVar7 = 0;
        }
        return eVar7;
      }
      iVar8 = strcmp(name,*ppcVar9);
      if (iVar8 < 0) {
        local_78 = uVar15 & 0xffffffff;
        goto LAB_0011a83d;
      }
      if (iVar8 == 0) {
        UNRECOVERED_JUMPTABLE = ctxt->print_error;
        pcVar13 = "Attempt to add duplicate channel \'%s\' to channel list";
        goto LAB_0011a730;
      }
      uVar15 = uVar15 + 1;
      ppcVar9 = ppcVar9 + 4;
    } while( true );
  }
  UNRECOVERED_JUMPTABLE = ctxt->print_error;
  pcVar13 = "Channel name must not be empty, received \'%s\'";
LAB_0011a730:
  eVar7 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar13,name,UNRECOVERED_JUMPTABLE);
  return eVar7;
}

Assistant:

exr_result_t
exr_attr_chlist_add_with_length (
    exr_context_t              ctxt,
    exr_attr_chlist_t*         clist,
    const char*                name,
    int32_t                    namelen,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    exr_attr_chlist_entry_t  nent = {{0}};
    exr_attr_chlist_entry_t *nlist, *olist;
    int                      newcount, insertpos;
    int32_t                  maxlen;
    exr_result_t             rv;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    maxlen = ctxt->max_name_length;

    if (!clist)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid channel list pointer to chlist_add_with_length");

    if (!name || name[0] == '\0' || namelen == 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Channel name must not be empty, received '%s'",
            (name ? name : "<NULL>"));

    if (namelen > maxlen)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Channel name must shorter than length allowed by file (%d), received '%s' (%d)",
            maxlen,
            name,
            namelen);

    if (ptype != EXR_PIXEL_UINT && ptype != EXR_PIXEL_HALF &&
        ptype != EXR_PIXEL_FLOAT)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid pixel type specified (%d) adding channel '%s' to list",
            (int) ptype,
            name);

    if (islinear != EXR_PERCEPTUALLY_LOGARITHMIC &&
        islinear != EXR_PERCEPTUALLY_LINEAR)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid perceptual linear flag value (%d) adding channel '%s' to list",
            (int) islinear,
            name);

    if (xsamp <= 0 || ysamp <= 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid pixel sampling (x %d y %d) adding channel '%s' to list",
            xsamp,
            ysamp,
            name);

    insertpos = 0;
    olist     = EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);
    for (int32_t c = 0; c < clist->num_channels; ++c)
    {
        int ord = strcmp (name, olist[c].name.str);
        if (ord < 0)
        {
            insertpos = c;
            break;
        }
        else if (ord == 0)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Attempt to add duplicate channel '%s' to channel list",
                name);
        }
        else
            insertpos = c + 1;
    }

    /* temporarily use newcount as a return value check */
    rv = exr_attr_string_create_with_length (ctxt, &(nent.name), name, namelen);
    if (rv != EXR_ERR_SUCCESS) return rv;

    newcount        = clist->num_channels + 1;
    nent.pixel_type = ptype;
    nent.p_linear   = (uint8_t) islinear;
    nent.x_sampling = xsamp;
    nent.y_sampling = ysamp;

    if (newcount > clist->num_alloced)
    {
        int nsz = clist->num_alloced * 2;
        if (newcount > nsz) nsz = newcount + 1;
        nlist = (exr_attr_chlist_entry_t*) ctxt->alloc_fn (
            sizeof (*nlist) * (size_t) nsz);
        if (nlist == NULL)
        {
            exr_attr_string_destroy (ctxt, &(nent.name));
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
        clist->num_alloced = nsz;
    }
    else
        nlist = EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);

    /* since we can re-use same memory, have to have slightly more
     * complex logic to avoid overwrites, find where we will insert
     * and copy entries after that first */

    /* shift old entries further first */
    for (int i = newcount - 1; i > insertpos; --i)
        nlist[i] = olist[i - 1];
    nlist[insertpos] = nent;
    if (olist && nlist != olist)
    {
        for (int i = 0; i < insertpos; ++i)
            nlist[i] = olist[i];

        ctxt->free_fn (olist);
    }

    clist->num_channels = newcount;
    clist->entries      = nlist;

    return EXR_ERR_SUCCESS;
}